

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::BindImage
          (GLContextState *this,Uint32 Index,TextureViewGLImpl *pTexView,GLint MipLevel,
          GLboolean IsLayered,GLint Layer,GLenum Access,GLenum Format)

{
  vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
  *this_00;
  GLboolean *pGVar1;
  pointer pBVar2;
  bool bVar3;
  Int32 IVar4;
  GLTextureObj *pGVar5;
  ulong uVar6;
  pointer pBVar7;
  GLenum err;
  BoundImageInfo NewImageInfo;
  string msg;
  
  IVar4 = DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::ITextureViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureViewDesc>
                         *)pTexView);
  pGVar5 = TextureViewGLImpl::GetHandle(pTexView);
  NewImageInfo.GLHandle = pGVar5->m_uiHandle;
  NewImageInfo.IsLayered = IsLayered;
  NewImageInfo.Access = Access;
  NewImageInfo.Format = Format;
  uVar6 = (ulong)Index;
  this_00 = &this->m_BoundImages;
  pBVar7 = (this->m_BoundImages).
           super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  NewImageInfo.InterfaceID = IVar4;
  NewImageInfo.MipLevel = MipLevel;
  NewImageInfo.Layer = Layer;
  if ((ulong)(((long)(this->m_BoundImages).
                     super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar7) / 0x1c) <= uVar6) {
    std::
    vector<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
    ::resize(this_00,uVar6 + 1);
    pBVar7 = (this_00->
             super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  bVar3 = BoundImageInfo::operator!=(pBVar7 + uVar6,&NewImageInfo);
  if (bVar3) {
    pBVar7 = (this_00->
             super__Vector_base<Diligent::GLContextState::BoundImageInfo,_std::allocator<Diligent::GLContextState::BoundImageInfo>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = pBVar7 + uVar6;
    pGVar1 = &pBVar2->IsLayered;
    pBVar2->IsLayered = NewImageInfo.IsLayered;
    *(undefined3 *)&pBVar2->field_0xd = NewImageInfo._13_3_;
    *(GLint *)(pGVar1 + 4) = NewImageInfo.Layer;
    *(GLenum *)(pGVar1 + 8) = NewImageInfo.Access;
    *(GLenum *)(pGVar1 + 0xc) = NewImageInfo.Format;
    pBVar7 = pBVar7 + uVar6;
    pBVar7->InterfaceID = NewImageInfo.InterfaceID;
    pBVar7->GLHandle = NewImageInfo.GLHandle;
    pBVar7->MipLevel = NewImageInfo.MipLevel;
    pBVar7->IsLayered = NewImageInfo.IsLayered;
    *(undefined3 *)&pBVar7->field_0xd = NewImageInfo._13_3_;
    (*__glewBindImageTexture)(Index,NewImageInfo.GLHandle,MipLevel,IsLayered,Layer,Access,Format);
    err = glGetError();
    if (err != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120,(char (*) [28])"glBindImageTexture() failed",
                 (char (*) [17])"\nGL Error Code: ",&err);
      FormatString<char[6]>(&msg,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BindImage",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x120);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  return;
}

Assistant:

void GLContextState::BindImage(Uint32             Index,
                               TextureViewGLImpl* pTexView,
                               GLint              MipLevel,
                               GLboolean          IsLayered,
                               GLint              Layer,
                               GLenum             Access,
                               GLenum             Format)
{
#if GL_ARB_shader_image_load_store
    BoundImageInfo NewImageInfo //
        {
            pTexView->GetUniqueID(),
            pTexView->GetHandle(),
            MipLevel,
            IsLayered,
            Layer,
            Access,
            Format //
        };
    if (Index >= m_BoundImages.size())
        m_BoundImages.resize(size_t{Index} + 1);
    if (m_BoundImages[Index] != NewImageInfo)
    {
        m_BoundImages[Index] = NewImageInfo;
        glBindImageTexture(Index, NewImageInfo.GLHandle, MipLevel, IsLayered, Layer, Access, Format);
        DEV_CHECK_GL_ERROR("glBindImageTexture() failed");
    }
#else
    UNSUPPORTED("GL_ARB_shader_image_load_store is not supported");
#endif
}